

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRef.c
# Opt level: O1

void Rnm_ManJustify_rec(Rnm_Man_t *p,Gia_Obj_t *pObj,int f,Vec_Int_t *vSelect)

{
  Rnm_Obj_t RVar1;
  Rnm_Obj_t *pRVar2;
  Gia_Man_t *p_00;
  int iVar3;
  Rnm_Obj_t *pRVar4;
  Rnm_Obj_t *pRVar5;
  Gia_Obj_t *pGVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  bool bVar11;
  
  while( true ) {
    if (((~*(ulong *)pObj & 0x1fffffff1fffffff) != 0) && (pObj->Value == 0)) goto LAB_00611b18;
    uVar7 = pObj->Value;
    if (p->nObjsFrame <= (int)uVar7) goto LAB_00611af9;
    if ((f < 0) || (p->pCex->iFrame < f)) goto LAB_00611ada;
    iVar3 = p->nObjsFrame * f;
    pRVar2 = p->pObjs;
    if (((uint)pRVar2[(long)iVar3 + (ulong)uVar7] & 2) != 0) {
      return;
    }
    if (p->fPropFanout == 0) {
      pRVar2[(long)iVar3 + (ulong)uVar7] = (Rnm_Obj_t)((uint)pRVar2[(long)iVar3 + (ulong)uVar7] | 2)
      ;
      if (((*(ulong *)pObj & 0x1fffffff1fffffff) != 0x1fffffff1fffffff) && (pObj->Value == 0))
      goto LAB_00611b18;
      uVar10 = (ulong)pObj->Value;
      if (p->nObjsFrame <= (int)pObj->Value) goto LAB_00611af9;
      if (p->pCex->iFrame < 0) goto LAB_00611ada;
      RVar1 = p->pObjs[uVar10];
      if (((uint)RVar1 & 4) == 0) {
        if (uVar10 == 0 && (*(ulong *)pObj & 0x1fffffff1fffffff) != 0x1fffffff1fffffff)
        goto LAB_00611b18;
        p->pObjs[uVar10] = (Rnm_Obj_t)((uint)RVar1 | 4);
        p->nVisited = p->nVisited + 1;
      }
    }
    else {
      Rnm_ManJustifyPropFanout_rec(p,pObj,f,vSelect);
    }
    if (((uint)pRVar2[(long)iVar3 + (ulong)uVar7] & 8) != 0) break;
    p_00 = p->pGia;
    uVar10 = *(ulong *)pObj;
    uVar9 = (uint)uVar10;
    uVar8 = (uint)(uVar10 >> 0x20);
    if ((uVar9 & 0x9fffffff) == 0x9fffffff) {
      if ((~uVar10 & 0x1fffffff1fffffff) == 0) {
        return;
      }
      if ((int)(uVar8 & 0x1fffffff) < p_00->vCis->nSize - p_00->nRegs) {
        return;
      }
    }
    else if ((~uVar10 & 0x1fffffff1fffffff) == 0) {
      return;
    }
    if (((uVar9 & 0x9fffffff) == 0x9fffffff) &&
       (p_00->vCis->nSize - p_00->nRegs <= (int)(uVar8 & 0x1fffffff))) {
      bVar11 = f == 0;
      f = f + -1;
      if (bVar11) {
        return;
      }
      pGVar6 = Gia_ObjRoToRi(p_00,pObj);
      pObj = pGVar6 + -(ulong)((uint)*(undefined8 *)pGVar6 & 0x1fffffff);
    }
    else {
      if (((int)uVar9 < 0) || ((uVar9 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absRef.c"
                      ,0x25d,"void Rnm_ManJustify_rec(Rnm_Man_t *, Gia_Obj_t *, int, Vec_Int_t *)");
      }
      pRVar4 = Rnm_ManObj(p,pObj + -(ulong)(uVar9 & 0x1fffffff),f);
      pRVar5 = Rnm_ManObj(p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff),f);
      RVar1 = *pRVar4;
      if (((uint)pRVar2[(long)iVar3 + (ulong)uVar7] & 1) == 0) {
        uVar10 = *(ulong *)pObj;
        uVar9 = (uint)(uVar10 >> 0x1d) & 7 ^ (uint)RVar1;
        uVar7 = (uint)(uVar10 >> 0x20);
        if ((uVar9 & 1) == 0) {
          if (((uVar7 >> 0x1d ^ (uint)*pRVar5) & 1) == 0) {
            uVar7 = (uint)RVar1 >> 4 & 0xffffff;
            uVar9 = (uint)*pRVar5 >> 4 & 0xffffff;
            if (uVar9 < uVar7) {
              if (uVar9 == 0) {
                return;
              }
              goto LAB_0061199e;
            }
          }
          else {
            if ((uVar9 & 1) != 0) goto LAB_0061197e;
            uVar7 = (uint)RVar1 & 0xffffff0;
          }
          if (uVar7 == 0) {
            return;
          }
        }
        else {
LAB_0061197e:
          if (((uVar7 >> 0x1d ^ (uint)*pRVar5) & 1) != 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absRef.c"
                          ,0x25a,
                          "void Rnm_ManJustify_rec(Rnm_Man_t *, Gia_Obj_t *, int, Vec_Int_t *)");
          }
          if (((uint)*pRVar5 & 0xffffff0) == 0) {
            return;
          }
LAB_0061199e:
          uVar10 = uVar10 >> 0x20;
        }
        pObj = pObj + -(ulong)((uint)uVar10 & 0x1fffffff);
      }
      else {
        if (((uint)RVar1 & 0xffffff0) != 0) {
          Rnm_ManJustify_rec(p,pObj + -(ulong)((uint)*(undefined8 *)pObj & 0x1fffffff),f,vSelect);
        }
        if (((uint)*pRVar5 & 0xffffff0) == 0) {
          return;
        }
        pObj = pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff);
      }
    }
  }
  if (((uint)pRVar2[(long)iVar3 + (ulong)uVar7] & 0xffffff0) == 0) {
    __assert_fail("(int)pRnm->Prio > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absRef.c"
                  ,0x21f,"void Rnm_ManJustify_rec(Rnm_Man_t *, Gia_Obj_t *, int, Vec_Int_t *)");
  }
  if (p->fPropFanout == 0) {
    pGVar6 = p->pGia->pObjs;
    if ((pGVar6 <= pObj) && (pObj < pGVar6 + p->pGia->nObjs)) {
      Vec_IntPush(vSelect,(int)((ulong)((long)pObj - (long)pGVar6) >> 2) * -0x55555555);
      return;
    }
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  iVar3 = p->pCex->iFrame;
  if (-1 < iVar3) {
    do {
      if (((~*(ulong *)pObj & 0x1fffffff1fffffff) != 0) && (pObj->Value == 0)) {
LAB_00611b18:
        __assert_fail("Gia_ObjIsConst0(pObj) || pObj->Value",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absRef.h"
                      ,0x5f,"Rnm_Obj_t *Rnm_ManObj(Rnm_Man_t *, Gia_Obj_t *, int)");
      }
      if (p->nObjsFrame <= (int)pObj->Value) {
LAB_00611af9:
        __assert_fail("(int)pObj->Value < p->nObjsFrame",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absRef.h"
                      ,0x60,"Rnm_Obj_t *Rnm_ManObj(Rnm_Man_t *, Gia_Obj_t *, int)");
      }
      if (p->pCex->iFrame < iVar3) {
LAB_00611ada:
        __assert_fail("f >= 0 && f <= p->pCex->iFrame",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absRef.h"
                      ,0x61,"Rnm_Obj_t *Rnm_ManObj(Rnm_Man_t *, Gia_Obj_t *, int)");
      }
      if (((uint)p->pObjs[(long)(p->nObjsFrame * iVar3) + (ulong)pObj->Value] & 2) == 0) {
        Rnm_ManJustifyPropFanout_rec(p,pObj,iVar3,vSelect);
      }
      bVar11 = 0 < iVar3;
      iVar3 = iVar3 + -1;
    } while (bVar11);
  }
  return;
}

Assistant:

void Rnm_ManJustify_rec( Rnm_Man_t * p, Gia_Obj_t * pObj, int f, Vec_Int_t * vSelect )
{ 
    Rnm_Obj_t * pRnm = Rnm_ManObj( p, pObj, f );
    int i;//, Id = Gia_ObjId(p->pGia, pObj);
    if ( pRnm->fVisit )
        return;
    if ( p->fPropFanout )
        Rnm_ManJustifyPropFanout_rec( p, pObj, f, vSelect );
    else
    {
        pRnm->fVisit = 1;
        if ( Rnm_ManObj( p, pObj, 0 )->fVisitJ == 0 )
        {
            Rnm_ManObj( p, pObj, 0 )->fVisitJ = 1;
            p->nVisited++;
        }
    }
    if ( pRnm->fPPi )
    {
        assert( (int)pRnm->Prio > 0 );
        if ( p->fPropFanout )
        {
            for ( i = p->pCex->iFrame; i >= 0; i-- )
                if ( !Rnm_ManObj(p, pObj, i)->fVisit )
                    Rnm_ManJustifyPropFanout_rec( p, pObj, i, vSelect );
        }
        else
        {
            Vec_IntPush( vSelect, Gia_ObjId(p->pGia, pObj) );
//            for ( i = p->pCex->iFrame; i >= 0; i-- )
//                Rnm_ManObj(p, pObj, i)->fVisit = 1;
        }
        return;
    }
    if ( Gia_ObjIsPi(p->pGia, pObj) || Gia_ObjIsConst0(pObj) )
        return;
    if ( Gia_ObjIsRo(p->pGia, pObj) )
    {
        if ( f > 0 )
            Rnm_ManJustify_rec( p, Gia_ObjFanin0(Gia_ObjRoToRi(p->pGia, pObj)), f-1, vSelect );
        return;
    }
    if ( Gia_ObjIsAnd(pObj) )
    {
        Rnm_Obj_t * pRnm0 = Rnm_ManObj( p, Gia_ObjFanin0(pObj), f );
        Rnm_Obj_t * pRnm1 = Rnm_ManObj( p, Gia_ObjFanin1(pObj), f );
        if ( pRnm->Value == 1 )
        {
            if ( pRnm0->Prio > 0 )
                Rnm_ManJustify_rec( p, Gia_ObjFanin0(pObj), f, vSelect );
            if ( pRnm1->Prio > 0 )
                Rnm_ManJustify_rec( p, Gia_ObjFanin1(pObj), f, vSelect );
        }
        else // select one value
        {
            if ( (pRnm0->Value ^ Gia_ObjFaninC0(pObj)) == 0 && (pRnm1->Value ^ Gia_ObjFaninC1(pObj)) == 0 )
            {
                if ( pRnm0->Prio <= pRnm1->Prio ) // choice
                {
                    if ( pRnm0->Prio > 0 )
                        Rnm_ManJustify_rec( p, Gia_ObjFanin0(pObj), f, vSelect );
                }
                else
                {
                    if ( pRnm1->Prio > 0 )
                        Rnm_ManJustify_rec( p, Gia_ObjFanin1(pObj), f, vSelect );
                }
            }
            else if ( (pRnm0->Value ^ Gia_ObjFaninC0(pObj)) == 0 )
            {
                if ( pRnm0->Prio > 0 )
                    Rnm_ManJustify_rec( p, Gia_ObjFanin0(pObj), f, vSelect );
            }
            else if ( (pRnm1->Value ^ Gia_ObjFaninC1(pObj)) == 0 )
            {
                if ( pRnm1->Prio > 0 )
                    Rnm_ManJustify_rec( p, Gia_ObjFanin1(pObj), f, vSelect );
            }
            else assert( 0 );
        }
    }
    else assert( 0 );
}